

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

Memslot lookup_usable_reg(void *addr,char *func)

{
  Rdma *this;
  int pid;
  Memslot MVar1;
  Memblock *pMVar2;
  Memslot MStack_20;
  uint PUSHED;
  Memslot id;
  char *func_local;
  void *addr_local;
  
  if (addr == (void *)0x0) {
    __assert_fail("addr != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsp.cc"
                  ,0x168,"bsplib::Rdma::Memslot lookup_usable_reg(const void *, const char *)");
  }
  MStack_20 = bsplib::Rdma::lookup_reg(s_rdma,addr,false,true);
  MVar1 = bsplib::Rdma::no_slot();
  if (MStack_20 == MVar1) {
    MStack_20 = bsplib::Rdma::lookup_reg(s_rdma,addr,true,false);
    MVar1 = bsplib::Rdma::no_slot();
    this = s_rdma;
    if (MStack_20 != MVar1) {
      pid = bsplib::Spmd::pid(s_spmd);
      pMVar2 = bsplib::Rdma::slot(this,pid,MStack_20);
      if ((pMVar2->status & 1) != 0) {
        bsp_abort("%s: Remote address was just registered  with a bsp_push_reg(%p), but it hasn\'t become effective yet,  because bsp_sync() hasn\'t been performed yet\n"
                  ,func,addr);
        goto LAB_0011683c;
      }
    }
    bsp_abort("%s: Remote address %p was not registered\n",func,addr);
  }
LAB_0011683c:
  MVar1 = bsplib::Rdma::null_slot();
  if (MStack_20 == MVar1) {
    __assert_fail("id != s_rdma->null_slot()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsp.cc"
                  ,0x178,"bsplib::Rdma::Memslot lookup_usable_reg(const void *, const char *)");
  }
  return MStack_20;
}

Assistant:

static bsplib::Rdma::Memslot lookup_usable_reg( const void * addr, const char * func )
{
    assert( addr != NULL );

    bsplib::Rdma::Memslot id = 
        s_rdma->lookup_reg( const_cast<void*>(addr), false, true);
    if ( id == s_rdma->no_slot() ) {
        id = s_rdma->lookup_reg( addr, true, false );
        unsigned PUSHED = bsplib::Rdma::Memblock::PUSHED;
        if ( id != s_rdma->no_slot() && 
             ( s_rdma->slot(s_spmd->pid(), id).status & PUSHED) )
          bsp_abort("%s: Remote address was just registered "
                 " with a bsp_push_reg(%p), but it hasn't become effective yet, "
                " because bsp_sync() hasn't been performed yet\n", func, addr);
        else
          bsp_abort("%s: Remote address %p was not registered\n", func, addr );
    }

    assert( id != s_rdma->null_slot() );

    return id;
}